

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlgl.h
# Opt level: O1

uint rlCompileShader(char *shaderCode,int type)

{
  GLint GVar1;
  GLuint GVar2;
  GLchar *__ptr;
  ulong uVar3;
  char *pcVar4;
  int logType;
  int length;
  int maxLength;
  GLint success;
  GLsizei local_3c;
  GLint local_38;
  GLint local_34;
  char *local_30;
  
  local_30 = shaderCode;
  GVar2 = (*glad_glCreateShader)(type);
  uVar3 = (ulong)GVar2;
  (*glad_glShaderSource)(GVar2,1,&local_30,(GLint *)0x0);
  local_34 = 0;
  (*glad_glCompileShader)(GVar2);
  (*glad_glGetShaderiv)(GVar2,0x8b81,&local_34);
  if (local_34 == 0) {
    if (type == 0x91b9) {
      pcVar4 = "SHADER: Compute shaders not enabled. Define GRAPHICS_API_OPENGL_43";
    }
    else if (type == 0x8b31) {
      pcVar4 = "SHADER: [ID %i] Failed to compile vertex shader code";
    }
    else {
      if (type != 0x8b30) goto LAB_001624b5;
      pcVar4 = "SHADER: [ID %i] Failed to compile fragment shader code";
    }
    TraceLog(4,pcVar4,uVar3);
LAB_001624b5:
    local_38 = 0;
    (*glad_glGetShaderiv)(GVar2,0x8b84,&local_38);
    GVar1 = local_38;
    if (0 < (long)local_38) {
      local_3c = 0;
      __ptr = (GLchar *)calloc((long)local_38,1);
      (*glad_glGetShaderInfoLog)(GVar2,GVar1,&local_3c,__ptr);
      TraceLog(4,"SHADER: [ID %i] Compile error: %s",uVar3,__ptr);
      free(__ptr);
    }
    return 0;
  }
  if (type == 0x8b30) {
    pcVar4 = "SHADER: [ID %i] Fragment shader compiled successfully";
  }
  else {
    if (type == 0x91b9) {
      pcVar4 = "SHADER: Compute shaders not enabled. Define GRAPHICS_API_OPENGL_43";
      logType = 4;
      goto LAB_00162489;
    }
    if (type != 0x8b31) {
      return GVar2;
    }
    pcVar4 = "SHADER: [ID %i] Vertex shader compiled successfully";
  }
  logType = 3;
LAB_00162489:
  TraceLog(logType,pcVar4,uVar3);
  return GVar2;
}

Assistant:

unsigned int rlCompileShader(const char *shaderCode, int type)
{
    unsigned int shader = 0;

#if defined(GRAPHICS_API_OPENGL_33) || defined(GRAPHICS_API_OPENGL_ES2)
    shader = glCreateShader(type);
    glShaderSource(shader, 1, &shaderCode, NULL);

    GLint success = 0;
    glCompileShader(shader);
    glGetShaderiv(shader, GL_COMPILE_STATUS, &success);

    if (success == GL_FALSE)
    {
        switch (type)
        {
            case GL_VERTEX_SHADER: TRACELOG(RL_LOG_WARNING, "SHADER: [ID %i] Failed to compile vertex shader code", shader); break;
            case GL_FRAGMENT_SHADER: TRACELOG(RL_LOG_WARNING, "SHADER: [ID %i] Failed to compile fragment shader code", shader); break;
            //case GL_GEOMETRY_SHADER:
        #if defined(GRAPHICS_API_OPENGL_43)
            case GL_COMPUTE_SHADER: TRACELOG(RL_LOG_WARNING, "SHADER: [ID %i] Failed to compile compute shader code", shader); break;
        #elif defined(GRAPHICS_API_OPENGL_33)
            case GL_COMPUTE_SHADER: TRACELOG(RL_LOG_WARNING, "SHADER: Compute shaders not enabled. Define GRAPHICS_API_OPENGL_43", shader); break;
        #endif
            default: break;
        }

        int maxLength = 0;
        glGetShaderiv(shader, GL_INFO_LOG_LENGTH, &maxLength);

        if (maxLength > 0)
        {
            int length = 0;
            char *log = (char *)RL_CALLOC(maxLength, sizeof(char));
            glGetShaderInfoLog(shader, maxLength, &length, log);
            TRACELOG(RL_LOG_WARNING, "SHADER: [ID %i] Compile error: %s", shader, log);
            RL_FREE(log);
        }

        shader = 0;
    }
    else
    {
        switch (type)
        {
            case GL_VERTEX_SHADER: TRACELOG(RL_LOG_INFO, "SHADER: [ID %i] Vertex shader compiled successfully", shader); break;
            case GL_FRAGMENT_SHADER: TRACELOG(RL_LOG_INFO, "SHADER: [ID %i] Fragment shader compiled successfully", shader); break;
            //case GL_GEOMETRY_SHADER:
        #if defined(GRAPHICS_API_OPENGL_43)
            case GL_COMPUTE_SHADER: TRACELOG(RL_LOG_INFO, "SHADER: [ID %i] Compute shader compiled successfully", shader); break;
        #elif defined(GRAPHICS_API_OPENGL_33)
            case GL_COMPUTE_SHADER: TRACELOG(RL_LOG_WARNING, "SHADER: Compute shaders not enabled. Define GRAPHICS_API_OPENGL_43", shader); break;
        #endif
            default: break;
        }
    }
#endif

    return shader;
}